

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
               (DecimalCastData<long> *state,int32_t exponent)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  uVar6 = 0;
  uVar3 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar3 = uVar6;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar6 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar3 - exponent == 0 || (int)uVar3 < exponent) {
      uVar6 = exponent - uVar3;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar3 - exponent);
    }
  }
  bVar1 = Finalize<duckdb::DecimalCastData<long>,false>(state);
  if (bVar1) {
    if ((int)uVar6 < 0) {
      lVar7 = (long)(int)uVar6 + -1;
      bVar2 = false;
      lVar8 = state->result;
      do {
        lVar7 = lVar7 + 1;
        lVar4 = lVar8;
        if (lVar7 == 0) break;
        lVar4 = lVar8 / 10;
        bVar2 = 4 < lVar8 % 10;
        state->result = lVar4;
        uVar5 = lVar8 - 10;
        lVar8 = lVar4;
      } while (uVar5 < 0xffffffffffffffed);
      bVar1 = true;
      if (bVar2) {
        state->result = lVar4 + 1;
      }
    }
    else {
      lVar8 = (ulong)uVar6 + 1;
      do {
        lVar8 = lVar8 + -1;
        bVar1 = lVar8 == 0;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = HandleDigit<duckdb::DecimalCastData<long>,false>(state,'\0');
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}